

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_future.c
# Opt level: O2

future_return
future_await(future_conflict f,future_resolve_callback resolve_callback,
            future_reject_callback reject_callback,void *context)

{
  future_impl_interface_await UNRECOVERED_JUMPTABLE;
  future_return pvVar1;
  
  if (((f != (future_conflict)0x0) && (f->interface != (future_interface)0x0)) &&
     (UNRECOVERED_JUMPTABLE = f->interface->await,
     UNRECOVERED_JUMPTABLE != (future_impl_interface_await)0x0)) {
    pvVar1 = (*UNRECOVERED_JUMPTABLE)(f,f->impl,resolve_callback,reject_callback,context);
    return pvVar1;
  }
  return (future_return)0x0;
}

Assistant:

future_return future_await(future f, future_resolve_callback resolve_callback, future_reject_callback reject_callback, void *context)
{
	if (f != NULL)
	{
		if (f->interface != NULL && f->interface->await != NULL)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			log_write("metacall", LOG_LEVEL_DEBUG, "Await future (%p)", (void *)f);
			*/

			return f->interface->await(f, f->impl, resolve_callback, reject_callback, context);
		}
	}

	return NULL;
}